

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ExpectationBase * __thiscall
testing::internal::
FunctionMocker<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>::
UntypedFindMatchingExpectation
          (FunctionMocker<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
           *this,void *untyped_args,void **untyped_action,bool *is_excessive,ostream *what,
          ostream *why)

{
  simple_struct *x;
  bool bVar1;
  int iVar2;
  Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *pAVar3;
  undefined8 uVar4;
  ostream *poVar5;
  ostream *poVar6;
  pointer psVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *pTVar13;
  MutexLock l;
  string local_200;
  MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> local_1e0;
  stringstream ss;
  undefined1 local_1c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Rb_tree_node_base *local_1a8;
  undefined8 local_1a0;
  
  l.mutex_ = (MutexBase *)g_gmock_mutex;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  psVar7 = (this->super_UntypedFunctionMockerBase).untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    do {
      do {
        if (psVar7 == (this->super_UntypedFunctionMockerBase).untyped_expectations_.
                      super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
          std::operator<<(what,"\nUnexpected mock function call - ");
          DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,what);
          MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
          lVar8 = (long)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
                        super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
                        super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          poVar5 = std::operator<<(why,"Google Mock tried the following ");
          uVar9 = lVar8 >> 4;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5," ");
          pcVar10 = "expectations, but none matched";
          if (lVar8 == 0x10) {
            pcVar10 = "expectation, but it didn\'t match";
          }
          poVar5 = std::operator<<(poVar5,pcVar10);
          std::operator<<(poVar5,":\n");
          uVar12 = 0;
          goto LAB_0012331e;
        }
        pTVar13 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
                   *)psVar7[-1].
                     super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        ExpectationBase::CheckActionCountIfNotDone((ExpectationBase *)pTVar13);
        bVar1 = ExpectationBase::is_retired((ExpectationBase *)pTVar13);
        psVar7 = psVar7 + -1;
      } while (bVar1);
      bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)pTVar13);
    } while (!bVar1);
    bVar1 = TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>::
            Matches(pTVar13,(ArgumentTuple *)untyped_args);
  } while (!bVar1);
  bVar1 = ExpectationBase::IsSaturated((ExpectationBase *)pTVar13);
  *is_excessive = bVar1;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = ExpectationBase::IsSaturated((ExpectationBase *)pTVar13);
  ExpectationBase::IncrementCallCount((ExpectationBase *)pTVar13);
  if (bVar1) {
    std::operator<<(what,"Mock function called more times than expected - ");
    DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,what);
    ExpectationBase::DescribeCallCountTo((ExpectationBase *)pTVar13,why);
LAB_0012326a:
    pAVar3 = (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)0x0;
  }
  else {
    ExpectationBase::RetireAllPreRequisites((ExpectationBase *)pTVar13);
    if ((pTVar13->super_ExpectationBase).retires_on_saturation_ == true) {
      bVar1 = ExpectationBase::IsSaturated((ExpectationBase *)pTVar13);
      if (bVar1) {
        ExpectationBase::Retire((ExpectationBase *)pTVar13);
      }
    }
    poVar5 = std::operator<<(what,"Mock function call matches ");
    poVar5 = std::operator<<(poVar5,(pTVar13->super_ExpectationBase).source_text_._M_dataplus._M_p);
    std::operator<<(poVar5,"...\n");
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    iVar2 = ExpectationBase::call_count((ExpectationBase *)pTVar13);
    std::__cxx11::string::string
              ((string *)&ss,
               "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
               (allocator *)&local_200);
    Assert(0 < iVar2,
           "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/include/gmock/gmock-spec-builders.h"
           ,0x494,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    iVar11 = (int)((ulong)((long)(pTVar13->super_ExpectationBase).untyped_actions_.
                                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar13->super_ExpectationBase).untyped_actions_.
                                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (((0 < iVar11) && (iVar11 < iVar2)) &&
       ((pTVar13->super_ExpectationBase).repeated_action_specified_ == false)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = (ostream *)(local_1c0 + 8);
      ExpectationBase::DescribeLocationTo((ExpectationBase *)pTVar13,poVar5);
      poVar6 = std::operator<<(poVar5,"Actions ran out in ");
      poVar6 = std::operator<<(poVar6,(pTVar13->super_ExpectationBase).source_text_._M_dataplus._M_p
                              );
      poVar6 = std::operator<<(poVar6,"...\n");
      poVar6 = std::operator<<(poVar6,"Called ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      poVar6 = std::operator<<(poVar6," times, but only ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
      poVar6 = std::operator<<(poVar6," WillOnce()");
      pcVar10 = "s are";
      if (iVar11 == 1) {
        pcVar10 = " is";
      }
      poVar6 = std::operator<<(poVar6,pcVar10);
      std::operator<<(poVar6," specified - ");
      DescribeDefaultActionTo(this,(ArgumentTuple *)untyped_args,poVar5);
      std::__cxx11::stringbuf::str();
      Log(kWarning,&local_200,1);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    if (iVar11 < iVar2) {
      pAVar3 = &pTVar13->repeated_action_;
    }
    else {
      pAVar3 = (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)
               (pTVar13->super_ExpectationBase).untyped_actions_.
               super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
               super__Vector_impl_data._M_start[(long)iVar2 + -1];
      if (pAVar3 == (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)
                    0x0) goto LAB_0012326a;
    }
    if ((pAVar3->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
      pAVar3 = (Action<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)> *)0x0;
    }
  }
  *untyped_action = pAVar3;
LAB_0012369a:
  GTestMutexLock::~GTestMutexLock(&l);
  return &pTVar13->super_ExpectationBase;
LAB_0012331e:
  if (uVar12 == uVar9) goto LAB_00123697;
  pTVar13 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
             *)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
               super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
  std::operator<<(why,"\n");
  ExpectationBase::DescribeLocationTo((ExpectationBase *)pTVar13,why);
  if (1 < uVar9) {
    poVar5 = std::operator<<(why,"tried expectation #");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,": ");
  }
  poVar5 = std::operator<<(why,(pTVar13->super_ExpectationBase).source_text_._M_dataplus._M_p);
  std::operator<<(poVar5,"...\n");
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = ExpectationBase::is_retired((ExpectationBase *)pTVar13);
  if (bVar1) {
    poVar5 = std::operator<<(why,"         Expected: the expectation is active\n");
    pcVar10 = "           Actual: it is retired\n";
LAB_001233d1:
    std::operator<<(poVar5,pcVar10);
  }
  else {
    bVar1 = TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>::
            Matches(pTVar13,(ArgumentTuple *)untyped_args);
    if (bVar1) {
      bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)pTVar13);
      pcVar10 = "The call matches the expectation.\n";
      poVar5 = why;
      if (bVar1) goto LAB_001233d1;
      poVar5 = std::operator<<(why,"         Expected: all pre-requisites are satisfied\n");
      poVar5 = std::operator<<(poVar5,"           Actual: the following immediate pre-requisites ");
      std::operator<<(poVar5,"are not satisfied:\n");
      local_1c0._0_4_ = _S_red;
      local_1b8._M_allocated_capacity = 0;
      local_1b8._8_8_ = local_1c0;
      local_1a0 = 0;
      local_1a8 = (_Rb_tree_node_base *)local_1b8._8_8_;
      ExpectationBase::FindUnsatisfiedPrerequisites
                ((ExpectationBase *)pTVar13,(ExpectationSet *)&ss);
      iVar2 = 0;
      uVar4 = local_1b8._8_8_;
      while ((_Rb_tree_node_base *)uVar4 != (_Rb_tree_node_base *)local_1c0) {
        ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(uVar4 + 0x20),why);
        poVar5 = std::operator<<(why,"pre-requisite #");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        std::operator<<(poVar5,"\n");
        uVar4 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar4);
        iVar2 = iVar2 + 1;
      }
      std::operator<<(why,"                   (end of pre-requisites)\n");
      std::
      _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
      ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                   *)&ss);
    }
    else {
      bVar1 = TupleMatches<std::tuple<testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct&>>,std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct&>>
                        (&pTVar13->matchers_,
                         (tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *)
                         untyped_args);
      if (!bVar1) {
        local_1e0.vtable_ =
             (pTVar13->matchers_).
             super__Tuple_impl<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_>
             .
             super__Head_base<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>,_false>
             ._M_head_impl.
             super_MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>.
             vtable_;
        local_1e0.buffer_ =
             (Buffer)(pTVar13->matchers_).
                     super__Tuple_impl<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_>
                     .
                     super__Head_base<0UL,_testing::Matcher<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>,_false>
                     ._M_head_impl.
                     super_MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                     .buffer_.shared;
        if ((local_1e0.vtable_ != (VTable *)0x0) &&
           ((local_1e0.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
          LOCK();
          ((local_1e0.buffer_.shared)->ref).super___atomic_base<int>._M_i =
               ((local_1e0.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_1e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherBase_00186f38;
        x = *untyped_args;
        StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)&ss);
        bVar1 = MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::
                MatchAndExplain(&local_1e0,x,(MatchResultListener *)&ss);
        if (!bVar1) {
          poVar5 = std::operator<<(why,"  Expected arg #");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,": ");
          MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::DescribeTo
                    ((MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *)
                     &pTVar13->matchers_,why);
          std::operator<<(why,"\n           Actual: ");
          UniversalPrint<(anonymous_namespace)::SerializeSpanFallback::simple_struct>(x,why);
          std::__cxx11::stringbuf::str();
          PrintIfNotEmpty(&local_200,why);
          std::__cxx11::string::~string((string *)&local_200);
          std::operator<<(why,"\n");
        }
        StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)&ss);
        MatcherBase<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>::~MatcherBase
                  (&local_1e0);
      }
      StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)&ss);
      bVar1 = MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
              ::MatchAndExplain(&(pTVar13->extra_matcher_).
                                 super_MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
                                ,(tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
                                  *)untyped_args,(MatchResultListener *)&ss);
      if (!bVar1) {
        std::operator<<(why,"    Expected args: ");
        MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
        ::DescribeTo(&(pTVar13->extra_matcher_).
                      super_MatcherBase<const_std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>_&>
                     ,why);
        std::operator<<(why,"\n           Actual: don\'t match");
        std::__cxx11::stringbuf::str();
        PrintIfNotEmpty(&local_200,why);
        std::__cxx11::string::~string((string *)&local_200);
        std::operator<<(why,"\n");
      }
      StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)&ss);
    }
  }
  ExpectationBase::DescribeCallCountTo((ExpectationBase *)pTVar13,why);
  uVar12 = uVar12 + 1;
  goto LAB_0012331e;
LAB_00123697:
  pTVar13 = (TypedExpectation<void_((anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
             *)0x0;
  goto LAB_0012369a;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    MutexLock l(&g_gmock_mutex);
    TypedExpectation<F>* exp = this->FindMatchingExpectationLocked(args);
    if (exp == nullptr) {  // A match wasn't found.
      this->FormatUnexpectedCallMessageLocked(args, what, why);
      return nullptr;
    }

    // This line must be done before calling GetActionForArguments(),
    // which will increment the call count for *exp and thus affect
    // its saturation status.
    *is_excessive = exp->IsSaturated();
    const Action<F>* action = exp->GetActionForArguments(this, args, what, why);
    if (action != nullptr && action->IsDoDefault())
      action = nullptr;  // Normalize "do default" to NULL.
    *untyped_action = action;
    return exp;
  }